

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sampleInsert(Stat4Accum *p,Stat4Sample *pNew,int nEqZero)

{
  tRowcnt *ptVar1;
  tRowcnt *ptVar2;
  tRowcnt *ptVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  Stat4Sample *pNew_00;
  uint uVar8;
  uint uVar9;
  Stat4Sample *pSVar10;
  Stat4Sample *pSVar11;
  
  if (p->nMaxEqZero < nEqZero) {
    p->nMaxEqZero = nEqZero;
  }
  uVar8 = p->nSample;
  if (0 < (int)uVar8 && pNew->isPSample == '\0') {
    iVar5 = pNew->iCol;
    uVar7 = (ulong)uVar8 + 1;
    pSVar11 = (Stat4Sample *)0x0;
    pSVar10 = p->a + uVar8;
    do {
      pNew_00 = pSVar10 + -1;
      if (pNew_00->anEq[iVar5] == 0) {
        if (pSVar10[-1].isPSample != '\0') {
          return;
        }
        if ((pSVar11 == (Stat4Sample *)0x0) ||
           (iVar4 = sampleIsBetter(p,pNew_00,pSVar11), iVar4 != 0)) {
          pSVar11 = pNew_00;
        }
      }
      uVar7 = uVar7 - 1;
      pSVar10 = pNew_00;
    } while (1 < uVar7);
    if (pSVar11 != (Stat4Sample *)0x0) {
      iVar5 = pNew->iCol;
      pSVar11->iCol = iVar5;
      pSVar11->anEq[iVar5] = pNew->anEq[iVar5];
      goto LAB_00195599;
    }
  }
  pSVar10 = p->a;
  if (p->mxSample <= (int)uVar8) {
    uVar9 = p->iMin;
    pSVar11 = pSVar10 + (int)uVar9;
    ptVar1 = pSVar10[(int)uVar9].anLt;
    ptVar2 = pSVar10[(int)uVar9].anEq;
    ptVar3 = pSVar10[(int)uVar9].anDLt;
    if (pSVar10[(int)uVar9].nRowid != 0) {
      if ((pSVar11->u).aRowid != (u8 *)0x0) {
        sqlite3DbFreeNN(p->db,(pSVar11->u).aRowid);
        uVar9 = p->iMin;
        uVar8 = p->nSample;
      }
      pSVar11->nRowid = 0;
    }
    memmove(pSVar11,pSVar11 + 1,(long)(int)(~uVar9 + uVar8) * 0x30);
    pSVar10 = p->a;
    lVar6 = (long)p->nSample;
    pSVar10[lVar6 + -1].nRowid = 0;
    pSVar10[lVar6 + -1].anEq = ptVar2;
    pSVar10[lVar6 + -1].anDLt = ptVar3;
    pSVar10[lVar6 + -1].anLt = ptVar1;
    uVar8 = p->mxSample - 1;
    p->nSample = uVar8;
  }
  sampleCopy(p,pSVar10 + (int)uVar8,pNew);
  p->nSample = p->nSample + 1;
  memset(pSVar10[(int)uVar8].anEq,0,(long)nEqZero << 2);
LAB_00195599:
  uVar8 = p->mxSample;
  if ((int)uVar8 <= p->nSample) {
    if ((int)uVar8 < 1) {
      uVar9 = 0xffffffff;
    }
    else {
      pSVar10 = p->a;
      uVar9 = 0xffffffff;
      uVar7 = 0;
      pSVar11 = pSVar10;
      do {
        if ((pSVar11->isPSample == '\0') &&
           (((int)uVar9 < 0 || (iVar5 = sampleIsBetter(p,pSVar10 + uVar9,pSVar11), iVar5 != 0)))) {
          uVar9 = (uint)uVar7;
        }
        uVar7 = uVar7 + 1;
        pSVar11 = pSVar11 + 1;
      } while (uVar8 != uVar7);
    }
    p->iMin = uVar9;
  }
  return;
}

Assistant:

static void sampleInsert(Stat4Accum *p, Stat4Sample *pNew, int nEqZero){
  Stat4Sample *pSample = 0;
  int i;

  assert( IsStat4 || nEqZero==0 );

#ifdef SQLITE_ENABLE_STAT4
  /* Stat4Accum.nMaxEqZero is set to the maximum number of leading 0
  ** values in the anEq[] array of any sample in Stat4Accum.a[]. In
  ** other words, if nMaxEqZero is n, then it is guaranteed that there
  ** are no samples with Stat4Sample.anEq[m]==0 for (m>=n). */
  if( nEqZero>p->nMaxEqZero ){
    p->nMaxEqZero = nEqZero;
  }
  if( pNew->isPSample==0 ){
    Stat4Sample *pUpgrade = 0;
    assert( pNew->anEq[pNew->iCol]>0 );

    /* This sample is being added because the prefix that ends in column 
    ** iCol occurs many times in the table. However, if we have already
    ** added a sample that shares this prefix, there is no need to add
    ** this one. Instead, upgrade the priority of the highest priority
    ** existing sample that shares this prefix.  */
    for(i=p->nSample-1; i>=0; i--){
      Stat4Sample *pOld = &p->a[i];
      if( pOld->anEq[pNew->iCol]==0 ){
        if( pOld->isPSample ) return;
        assert( pOld->iCol>pNew->iCol );
        assert( sampleIsBetter(p, pNew, pOld) );
        if( pUpgrade==0 || sampleIsBetter(p, pOld, pUpgrade) ){
          pUpgrade = pOld;
        }
      }
    }
    if( pUpgrade ){
      pUpgrade->iCol = pNew->iCol;
      pUpgrade->anEq[pUpgrade->iCol] = pNew->anEq[pUpgrade->iCol];
      goto find_new_min;
    }
  }
#endif

  /* If necessary, remove sample iMin to make room for the new sample. */
  if( p->nSample>=p->mxSample ){
    Stat4Sample *pMin = &p->a[p->iMin];
    tRowcnt *anEq = pMin->anEq;
    tRowcnt *anLt = pMin->anLt;
    tRowcnt *anDLt = pMin->anDLt;
    sampleClear(p->db, pMin);
    memmove(pMin, &pMin[1], sizeof(p->a[0])*(p->nSample-p->iMin-1));
    pSample = &p->a[p->nSample-1];
    pSample->nRowid = 0;
    pSample->anEq = anEq;
    pSample->anDLt = anDLt;
    pSample->anLt = anLt;
    p->nSample = p->mxSample-1;
  }

  /* The "rows less-than" for the rowid column must be greater than that
  ** for the last sample in the p->a[] array. Otherwise, the samples would
  ** be out of order. */
#ifdef SQLITE_ENABLE_STAT4
  assert( p->nSample==0 
       || pNew->anLt[p->nCol-1] > p->a[p->nSample-1].anLt[p->nCol-1] );
#endif

  /* Insert the new sample */
  pSample = &p->a[p->nSample];
  sampleCopy(p, pSample, pNew);
  p->nSample++;

  /* Zero the first nEqZero entries in the anEq[] array. */
  memset(pSample->anEq, 0, sizeof(tRowcnt)*nEqZero);

#ifdef SQLITE_ENABLE_STAT4
 find_new_min:
#endif
  if( p->nSample>=p->mxSample ){
    int iMin = -1;
    for(i=0; i<p->mxSample; i++){
      if( p->a[i].isPSample ) continue;
      if( iMin<0 || sampleIsBetter(p, &p->a[iMin], &p->a[i]) ){
        iMin = i;
      }
    }
    assert( iMin>=0 );
    p->iMin = iMin;
  }
}